

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Response_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Repair_Response_PDU::Encode(Repair_Response_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Repair_Response_PDU *this_local;
  
  Logistics_Header::Encode(&this->super_Logistics_Header,stream);
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8RepairResult);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Padding);
  KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  return;
}

Assistant:

void Repair_Response_PDU::Encode( KDataStream & stream ) const
{
    Logistics_Header::Encode( stream );
    stream << m_ui8RepairResult
           << m_ui8Padding
           << m_ui16Padding;
}